

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void StrVariableCommand(IResult *pResult,void *pUserData)

{
  int iVar1;
  int iVar2;
  uint size;
  undefined4 extraout_var;
  int iVar3;
  byte *str;
  long in_FS_OFFSET;
  char Temp [4];
  char acStack_438 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pResult->m_NumArgs == 0) {
    str_format(acStack_438,0x400,"Value: %s",*(undefined8 *)((long)pUserData + 8));
    (**(code **)(**pUserData + 200))(*pUserData,0,"console",acStack_438,0);
    str_copy(pResult->m_aValue,*(char **)((long)pUserData + 8),0x80);
  }
  else {
    iVar3 = 0;
    iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
    str = (byte *)CONCAT44(extraout_var,iVar2);
    iVar2 = str_utf8_check((char *)str);
    if (iVar2 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        str_utf8_copy_num(*(char **)((long)pUserData + 8),(char *)str,
                          *(int *)((long)pUserData + 0x10),*(int *)((long)pUserData + 0x14));
        return;
      }
      goto LAB_0012c893;
    }
    do {
      if (*str == 0) break;
      size = str_utf8_encode(acStack_438,(uint)*str);
      iVar2 = size + iVar3;
      iVar1 = *(int *)((long)pUserData + 0x10);
      if (iVar2 < iVar1) {
        mem_copy((void *)((long)iVar3 + *(long *)((long)pUserData + 8)),acStack_438,size);
        iVar3 = iVar2;
      }
      str = str + 1;
    } while (iVar2 < iVar1);
    *(undefined1 *)(*(long *)((long)pUserData + 8) + (long)iVar3) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0012c893:
  __stack_chk_fail();
}

Assistant:

static void StrVariableCommand(IConsole::IResult *pResult, void *pUserData)
{
	CStrVariableData *pData = (CStrVariableData *)pUserData;

	if(pResult->NumArguments())
	{
		const char *pString = pResult->GetString(0);
		if(!str_utf8_check(pString))
		{
			char Temp[4];
			int Length = 0;
			while(*pString)
			{
				int Size = str_utf8_encode(Temp, static_cast<unsigned char>(*pString++));
				if(Length+Size < pData->m_MaxSize)
				{
					mem_copy(pData->m_pStr+Length, &Temp, Size);
					Length += Size;
				}
				else
					break;
			}
			pData->m_pStr[Length] = 0;
		}
		else
			str_utf8_copy_num(pData->m_pStr, pString, pData->m_MaxSize, pData->m_Length);
	}
	else
	{
		char aBuf[1024];
		str_format(aBuf, sizeof(aBuf), "Value: %s", pData->m_pStr);
		pData->m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);
		str_copy(pResult->m_aValue, pData->m_pStr, sizeof(pResult->m_aValue));
	}
}